

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O0

void __thiscall HeavyLight_Chains_Test::TestBody(HeavyLight_Chains_Test *this)

{
  int iVar1;
  bool bVar2;
  reference this_00;
  size_type sVar3;
  reference lhs;
  reference pvVar4;
  char *message;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  int i;
  vector<int,_std::allocator<int>_> *c;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2;
  int tests;
  int n;
  HeavyLight_Chains_Test *this_local;
  
  srand(1);
  for (__range2._0_4_ = 0; (int)__range2 < 10; __range2._0_4_ = (int)__range2 + 1) {
    reset(0x32);
    generateTree(0x32);
    initHLD(0,0x32);
    __end2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::begin(&chains);
    c = (vector<int,_std::allocator<int>_> *)
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::end(&chains);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                       *)&c), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator*(&__end2);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(this_00);
      iVar1 = (int)sVar3;
      while (gtest_ar.message_.ptr_._4_4_ = iVar1 + -1, 0 < gtest_ar.message_.ptr_._4_4_) {
        lhs = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(iVar1 + -2));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this_00,(long)gtest_ar.message_.ptr_._4_4_);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_50,"c[i - 1]","pred[c[i]][0]",lhs,pred[*pvVar4]);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
        if (!bVar2) {
          testing::Message::Message(local_68);
          message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/heavylight_test.cpp"
                     ,0x1a,message);
          testing::internal::AssertHelper::operator=(&local_70,local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          testing::Message::~Message(local_68);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
        iVar1 = gtest_ar.message_.ptr_._4_4_;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

TEST(HeavyLight, Chains) {
    srand(1);
    int n = 50;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        for (auto &c : chains) {
            per(i, 1, c.size()) {
                EXPECT_EQ(c[i - 1], pred[c[i]][0]);
            }
        }
    }
}